

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  uchar *in_00;
  int iVar1;
  uint uVar2;
  size_t size;
  uchar *puVar3;
  size_t outsize;
  uchar *data;
  size_t insize_local;
  uchar *in_local;
  LodePNGState *state_local;
  uint *h_local;
  uint *w_local;
  uchar **out_local;
  
  *out = (uchar *)0x0;
  decodeGeneric(out,w,h,state,in,insize);
  if (state->error == 0) {
    if (((state->decoder).color_convert == 0) ||
       (iVar1 = lodepng_color_mode_equal(&state->info_raw,&(state->info_png).color), iVar1 != 0)) {
      if ((state->decoder).color_convert == 0) {
        uVar2 = lodepng_color_mode_copy(&state->info_raw,&(state->info_png).color);
        state->error = uVar2;
        if (state->error != 0) {
          return state->error;
        }
      }
    }
    else {
      in_00 = *out;
      if ((((state->info_raw).colortype != LCT_RGB) && ((state->info_raw).colortype != LCT_RGBA)) &&
         ((state->info_raw).bitdepth != 8)) {
        return 0x38;
      }
      size = lodepng_get_raw_size(*w,*h,&state->info_raw);
      puVar3 = (uchar *)lodepng_malloc(size);
      *out = puVar3;
      if (*out == (uchar *)0x0) {
        state->error = 0x53;
      }
      else {
        uVar2 = lodepng_convert(*out,in_00,&state->info_raw,&(state->info_png).color,*w,*h);
        state->error = uVar2;
      }
      lodepng_free(in_00);
    }
    out_local._4_4_ = state->error;
  }
  else {
    out_local._4_4_ = state->error;
  }
  return out_local._4_4_;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize)
{
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color))
  {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert)
    {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  }
  else
  {
    /*color conversion needed; sort of copy of the data*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from greyscale input color type, to 8-bit greyscale or greyscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8))
    {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out))
    {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}